

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void avePooling(pBox *pbox,pBox *Matrix,int kernelSize,int stride)

{
  int iVar1;
  mydataFmt *pmVar2;
  ostream *this;
  int local_50;
  int local_4c;
  int i;
  int kernelRow;
  int channel;
  int col;
  int row;
  mydataFmt sumNum;
  mydataFmt *ptemp;
  mydataFmt *pIn;
  mydataFmt *p;
  int stride_local;
  int kernelSize_local;
  pBox *Matrix_local;
  pBox *pbox_local;
  
  if (pbox->pdata == (mydataFmt *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"the feature2Matrix pbox is NULL!!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    pIn = Matrix->pdata;
    if (((pbox->width - kernelSize) % stride == 0) && ((pbox->height - kernelSize) % stride == 0)) {
      for (channel = 0; channel < Matrix->height; channel = channel + 1) {
        for (kernelRow = 0; kernelRow < Matrix->width; kernelRow = kernelRow + 1) {
          pmVar2 = pbox->pdata;
          iVar1 = pbox->width;
          for (i = 0; i < pbox->channel; i = i + 1) {
            col = 0;
            for (local_4c = 0; local_4c < kernelSize; local_4c = local_4c + 1) {
              for (local_50 = 0; local_50 < kernelSize; local_50 = local_50 + 1) {
                col = (int)(pmVar2[(long)(channel * stride * iVar1) +
                                   (long)(kernelRow * stride) +
                                   (long)(i * pbox->height * pbox->width) +
                                   (long)local_50 + (long)(local_4c * pbox->width)] + (float)col);
              }
            }
            pIn[i * Matrix->height * Matrix->width] = (float)col / (float)(kernelSize * kernelSize);
          }
          pIn = pIn + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void avePooling(const pBox *pbox, pBox *Matrix, int kernelSize, int stride) {
    if (pbox->pdata == NULL) {
        cout << "the feature2Matrix pbox is NULL!!" << endl;
        return;
    }
    mydataFmt *p = Matrix->pdata;
    mydataFmt *pIn;
    mydataFmt *ptemp;
    mydataFmt sumNum = 0;
    if ((pbox->width - kernelSize) % stride == 0 && (pbox->height - kernelSize) % stride == 0) {
        for (int row = 0; row < Matrix->height; row++) {
            for (int col = 0; col < Matrix->width; col++) {
                pIn = pbox->pdata + row * stride * pbox->width + col * stride;

                for (int channel = 0; channel < pbox->channel; channel++) {

                    ptemp = pIn + channel * pbox->height * pbox->width;
                    sumNum = 0;
                    for (int kernelRow = 0; kernelRow < kernelSize; kernelRow++) {
                        for (int i = 0; i < kernelSize; i++) {
                            sumNum += *(ptemp + i + kernelRow * pbox->width);
                        }
                    }
                    *(p + channel * Matrix->height * Matrix->width) = sumNum / (kernelSize * kernelSize);
                }
                p++;
            }
        }
    }
}